

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanStreamEnd(Scanner *this)

{
  undefined1 local_60 [8];
  Token T;
  Scanner *this_local;
  
  if (this->Column != 0) {
    this->Column = 0;
    this->Line = this->Line + 1;
  }
  T.Value.field_2._8_8_ = this;
  unrollIndent(this,-1);
  SmallVectorImpl<(anonymous_namespace)::SimpleKey>::clear
            (&(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>);
  this->IsSimpleKeyAllowed = false;
  Token::Token((Token *)local_60);
  local_60._0_4_ = TK_StreamEnd;
  T._0_8_ = this->Current;
  T.Range.Data = (char *)0x0;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_60);
  Token::~Token((Token *)local_60);
  return true;
}

Assistant:

bool Scanner::scanStreamEnd() {
  // Force an ending new line if one isn't present.
  if (Column != 0) {
    Column = 0;
    ++Line;
  }

  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  Token T;
  T.Kind = Token::TK_StreamEnd;
  T.Range = StringRef(Current, 0);
  TokenQueue.push_back(T);
  return true;
}